

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O0

void __thiscall FastPForLib::PFor2008::PFor2008(PFor2008 *this)

{
  IntegerCODEC *in_RDI;
  allocator_type *__a;
  undefined1 *__n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffe0;
  undefined1 local_9 [9];
  
  IntegerCODEC::IntegerCODEC(in_RDI);
  in_RDI->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_0046f048;
  __a = (allocator_type *)(in_RDI + 1);
  __n = local_9;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x143643);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffe0,(size_type)__n,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x143663);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x14367f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffe0,(size_type)__n,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x14369e);
  return;
}

Assistant:

PFor2008() : codedcopy(BlockSize), miss(BlockSize) {}